

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3auxNextMethod(sqlite3_vtab_cursor *pCursor)

{
  char **ppcVar1;
  int *piVar2;
  long *plVar3;
  sqlite3_module **ppsVar4;
  Fts3Table *p;
  sqlite3_vtab *psVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  sqlite3_int64 sVar12;
  sqlite3_int64 sVar13;
  int iVar14;
  sqlite3_int64 v;
  int local_3c;
  sqlite3_vtab *local_38;
  
  p = (Fts3Table *)pCursor->pVtab[1].pModule;
  pCursor[0x12].pVtab = (sqlite3_vtab *)((long)&(pCursor[0x12].pVtab)->pModule + 1);
  uVar9 = (ulong)*(int *)&pCursor[0x13].pVtab;
  uVar10 = uVar9;
  lVar11 = uVar9 << 4;
  while( true ) {
    uVar10 = uVar10 + 1;
    if ((long)*(int *)((long)&pCursor[0x13].pVtab + 4) <= (long)uVar10) break;
    uVar6 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar6;
    plVar3 = (long *)((long)&(pCursor[0x14].pVtab)->zErrMsg + lVar11);
    lVar11 = lVar11 + 0x10;
    if (0 < *plVar3) {
      *(uint *)&pCursor[0x13].pVtab = uVar6;
      return 0;
    }
  }
  *(int *)&pCursor[0x13].pVtab = (int)uVar9 + 1;
  iVar7 = sqlite3Fts3SegReaderStep(p,(Fts3MultiSegReader *)(pCursor + 1));
  if (iVar7 != 100) {
    *(undefined4 *)&pCursor[0x11].pVtab = 1;
    return iVar7;
  }
  local_3c = *(int *)&pCursor[0xb].pVtab;
  local_38 = pCursor[10].pVtab;
  if (pCursor[0xf].pVtab != (sqlite3_vtab *)0x0) {
    iVar7 = *(int *)&pCursor[0x10].pVtab;
    iVar14 = *(int *)&pCursor[9].pVtab;
    iVar8 = iVar14;
    if (iVar7 < iVar14) {
      iVar8 = iVar7;
    }
    iVar8 = memcmp(pCursor[0xf].pVtab,pCursor[8].pVtab,(long)iVar8);
    if ((iVar8 < 0) || ((iVar7 < iVar14 && (iVar8 == 0)))) {
      *(undefined4 *)&pCursor[0x11].pVtab = 1;
      return 0;
    }
  }
  iVar7 = fts3auxGrowStatArray((Fts3auxCursor *)pCursor,2);
  if (iVar7 != 0) {
    return 7;
  }
  iVar14 = 0;
  memset(pCursor[0x14].pVtab,0,(long)*(int *)((long)&pCursor[0x13].pVtab + 4) << 4);
  iVar7 = 0;
  sVar12 = 0;
  do {
    if (local_3c <= iVar14) {
      *(undefined4 *)&pCursor[0x13].pVtab = 0;
      return 0;
    }
    v = 0;
    iVar8 = sqlite3Fts3GetVarint((char *)((long)&local_38->pModule + (long)iVar14),&v);
    sVar13 = v;
    if (iVar7 == 0) {
      (pCursor[0x14].pVtab)->pModule =
           (sqlite3_module *)((long)&(pCursor[0x14].pVtab)->pModule->iVersion + 1);
      sVar13 = 0;
      iVar7 = 1;
    }
    else if (iVar7 == 1) {
      if (1 < v) {
        ppcVar1 = &(pCursor[0x14].pVtab)->zErrMsg;
        *ppcVar1 = *ppcVar1 + 1;
      }
LAB_0016689c:
      sVar13 = sVar12;
      if (v == 0) {
        iVar7 = 0;
      }
      else {
        if (v != 1) {
          psVar5 = pCursor[0x14].pVtab;
          ppsVar4 = &psVar5[1].pModule + (long)(int)sVar12 * 2;
          *ppsVar4 = (sqlite3_module *)((long)&(*ppsVar4)->iVersion + 1);
          piVar2 = &psVar5->nRef;
          *(long *)piVar2 = *(long *)piVar2 + 1;
          goto LAB_00166915;
        }
        iVar7 = 3;
      }
    }
    else {
      if (iVar7 == 2) goto LAB_0016689c;
      iVar7 = fts3auxGrowStatArray((Fts3auxCursor *)pCursor,(int)v + 2);
      if (iVar7 != 0) {
        return 7;
      }
      plVar3 = (long *)((long)&(pCursor[0x14].pVtab)->pModule +
                       ((sVar13 << 0x20) + 0x100000000 >> 0x1c));
      *plVar3 = *plVar3 + 1;
LAB_00166915:
      iVar7 = 2;
    }
    iVar14 = iVar14 + iVar8;
    sVar12 = sVar13;
  } while( true );
}

Assistant:

static int fts3auxNextMethod(sqlite3_vtab_cursor *pCursor){
  Fts3auxCursor *pCsr = (Fts3auxCursor *)pCursor;
  Fts3Table *pFts3 = ((Fts3auxTable *)pCursor->pVtab)->pFts3Tab;
  int rc;

  /* Increment our pretend rowid value. */
  pCsr->iRowid++;

  for(pCsr->iCol++; pCsr->iCol<pCsr->nStat; pCsr->iCol++){
    if( pCsr->aStat[pCsr->iCol].nDoc>0 ) return SQLITE_OK;
  }

  rc = sqlite3Fts3SegReaderStep(pFts3, &pCsr->csr);
  if( rc==SQLITE_ROW ){
    int i = 0;
    int nDoclist = pCsr->csr.nDoclist;
    char *aDoclist = pCsr->csr.aDoclist;
    int iCol;

    int eState = 0;

    if( pCsr->zStop ){
      int n = (pCsr->nStop<pCsr->csr.nTerm) ? pCsr->nStop : pCsr->csr.nTerm;
      int mc = memcmp(pCsr->zStop, pCsr->csr.zTerm, n);
      if( mc<0 || (mc==0 && pCsr->csr.nTerm>pCsr->nStop) ){
        pCsr->isEof = 1;
        return SQLITE_OK;
      }
    }

    if( fts3auxGrowStatArray(pCsr, 2) ) return SQLITE_NOMEM;
    memset(pCsr->aStat, 0, sizeof(struct Fts3auxColstats) * pCsr->nStat);
    iCol = 0;

    while( i<nDoclist ){
      sqlite3_int64 v = 0;

      i += sqlite3Fts3GetVarint(&aDoclist[i], &v);
      switch( eState ){
        /* State 0. In this state the integer just read was a docid. */
        case 0:
          pCsr->aStat[0].nDoc++;
          eState = 1;
          iCol = 0;
          break;

        /* State 1. In this state we are expecting either a 1, indicating
        ** that the following integer will be a column number, or the
        ** start of a position list for column 0.  
        ** 
        ** The only difference between state 1 and state 2 is that if the
        ** integer encountered in state 1 is not 0 or 1, then we need to
        ** increment the column 0 "nDoc" count for this term.
        */
        case 1:
          assert( iCol==0 );
          if( v>1 ){
            pCsr->aStat[1].nDoc++;
          }
          eState = 2;
          /* fall through */

        case 2:
          if( v==0 ){       /* 0x00. Next integer will be a docid. */
            eState = 0;
          }else if( v==1 ){ /* 0x01. Next integer will be a column number. */
            eState = 3;
          }else{            /* 2 or greater. A position. */
            pCsr->aStat[iCol+1].nOcc++;
            pCsr->aStat[0].nOcc++;
          }
          break;

        /* State 3. The integer just read is a column number. */
        default: assert( eState==3 );
          iCol = (int)v;
          if( fts3auxGrowStatArray(pCsr, iCol+2) ) return SQLITE_NOMEM;
          pCsr->aStat[iCol+1].nDoc++;
          eState = 2;
          break;
      }
    }

    pCsr->iCol = 0;
    rc = SQLITE_OK;
  }else{
    pCsr->isEof = 1;
  }
  return rc;
}